

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

bool __thiscall QDomNodeListPrivate::checkNode(QDomNodeListPrivate *this,QDomNodePrivate *p)

{
  long lVar1;
  long lVar2;
  char16_t *pcVar3;
  byte bVar4;
  char cVar5;
  undefined1 uVar6;
  int iVar7;
  QArrayData *unaff_RBX;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  
  bVar4 = 1;
  if (p != (QDomNodePrivate *)0x0) {
    iVar7 = (*p->_vptr_QDomNodePrivate[0xb])(p);
    if (iVar7 == 1) {
      unaff_RBX = (QArrayData *)(this->nsURI).d.ptr;
      if (unaff_RBX == (QArrayData *)0x0) {
        unaff_RBX = &((p->name).d.d)->super_QArrayData;
        pcVar3 = (p->name).d.ptr;
        lVar1 = (p->name).d.size;
        if (unaff_RBX != (QArrayData *)0x0) {
          LOCK();
          (unaff_RBX->ref_)._q_value.super___atomic_base<int>._M_i =
               (unaff_RBX->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar2 = (this->tagname).d.size;
        if (lVar1 == lVar2) {
          QVar10.m_data = pcVar3;
          QVar10.m_size = lVar1;
          QVar13.m_data = (this->tagname).d.ptr;
          QVar13.m_size = lVar2;
          uVar6 = QtPrivate::equalStrings(QVar10,QVar13);
          bVar4 = 0;
        }
        else {
          bVar4 = 0;
          uVar6 = 0;
        }
        goto LAB_0010d936;
      }
      lVar1 = (p->name).d.size;
      lVar2 = (this->tagname).d.size;
      if (lVar1 == lVar2) {
        QVar8.m_data = (p->name).d.ptr;
        QVar8.m_size = lVar1;
        QVar11.m_data = (this->tagname).d.ptr;
        QVar11.m_size = lVar2;
        cVar5 = QtPrivate::equalStrings(QVar8,QVar11);
        if (cVar5 != '\0') {
          lVar1 = (p->namespaceURI).d.size;
          lVar2 = (this->nsURI).d.size;
          if (lVar1 == lVar2) {
            QVar9.m_data = (p->namespaceURI).d.ptr;
            QVar9.m_size = lVar1;
            QVar12.m_data = (storage_type_conflict *)unaff_RBX;
            QVar12.m_size = lVar2;
            uVar6 = QtPrivate::equalStrings(QVar9,QVar12);
            goto LAB_0010d936;
          }
        }
      }
    }
  }
  uVar6 = 0;
LAB_0010d936:
  if (!(bool)(unaff_RBX == (QArrayData *)0x0 | bVar4)) {
    LOCK();
    (unaff_RBX->ref_)._q_value.super___atomic_base<int>._M_i =
         (unaff_RBX->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((unaff_RBX->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(unaff_RBX,2,0x10);
    }
  }
  return (bool)uVar6;
}

Assistant:

bool QDomNodeListPrivate::checkNode(QDomNodePrivate *p) const
{
    return p && p->isElement() && (nsURI.isNull()
                                   ? p->nodeName() == tagname
                                   : p->name == tagname && p->namespaceURI == nsURI);
}